

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variation.cpp
# Opt level: O3

int __thiscall Variation::getLengthDifference(Variation *this)

{
  int iVar1;
  
  iVar1 = -*(int *)(this + 0x30);
  if (*(int *)(this + 0x60) != 1) {
    iVar1 = *(int *)(this + 0x30) - *(int *)(this + 0x28);
  }
  return iVar1;
}

Assistant:

int Variation::getLengthDifference() const {
	switch (type) {
	case Variation::INSERTION:
		return -(int)coord2;
	case Variation::DELETION:
		return ((int)coord2) - ((int)coord1);
	default:
		assert(false);
	}
}